

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

void postprocess_cpu_params(cpu_params *cpuparams,cpu_params *role_model)

{
  int32_t iVar1;
  long lVar2;
  common_log *log;
  uint uVar3;
  
  if (cpuparams->n_threads < 0) {
    if (role_model == (cpu_params *)0x0) {
      iVar1 = cpu_get_num_math();
      cpuparams->n_threads = iVar1;
    }
    else {
      memcpy(cpuparams,role_model,0x214);
    }
  }
  uVar3 = 0;
  for (lVar2 = 4; lVar2 != 0x204; lVar2 = lVar2 + 1) {
    uVar3 = uVar3 + cpuparams->cpumask[lVar2 + -4];
  }
  if (((uVar3 != 0) && ((int)uVar3 < cpuparams->n_threads)) && (-1 < common_log_verbosity_thold)) {
    log = common_log_main();
    common_log_add(log,GGML_LOG_LEVEL_WARN,
                   "Not enough set bits in CPU mask (%d) to satisfy requested thread count: %d\n",
                   (ulong)uVar3,(ulong)(uint)cpuparams->n_threads);
    return;
  }
  return;
}

Assistant:

void postprocess_cpu_params(cpu_params& cpuparams, const cpu_params* role_model) {
    int32_t n_set = 0;

    if (cpuparams.n_threads < 0) {
        // Assuming everything about cpuparams is invalid
        if (role_model != nullptr) {
            cpuparams = *role_model;
        } else {
            cpuparams.n_threads = cpu_get_num_math();
        }
    }

    for (int32_t i = 0; i < GGML_MAX_N_THREADS; i++) {
        if (cpuparams.cpumask[i]) {
            n_set++;
        }
    }

    if (n_set && n_set < cpuparams.n_threads) {
        // Not enough set bits, may experience performance issues.
        LOG_WRN("Not enough set bits in CPU mask (%d) to satisfy requested thread count: %d\n", n_set, cpuparams.n_threads);
    }
}